

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O3

void __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::update(COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
         *this)

{
  ECOLOR_FORMAT EVar1;
  undefined4 uVar2;
  ITexture *pIVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  code *UNRECOVERED_JUMPTABLE;
  long lVar7;
  int iVar8;
  uint uVar9;
  undefined8 uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double in_XMM0_Qa;
  
  if (this->RequestTextureUpdate == false) {
    bVar4 = this->RequestDepthStencilUpdate;
    if ((bool)bVar4 == false) {
      return;
    }
  }
  else {
    lVar6 = *(long *)&(this->super_IRenderTarget).field_0x58;
    uVar14 = (ulong)((long)(this->super_IRenderTarget).Textures.m_data.
                           super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_IRenderTarget).Textures.m_data.
                          super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3;
    lVar7 = *(long *)&(this->super_IRenderTarget).field_0x60;
    uVar12 = (ulong)(lVar7 - lVar6) >> 2;
    uVar9 = (uint)uVar14;
    uVar11 = (uint)uVar12;
    uVar5 = uVar11;
    if (uVar9 < uVar11) {
      uVar5 = uVar9;
    }
    if (uVar5 != 0) {
      uVar13 = 0;
      do {
        pIVar3 = (this->super_IRenderTarget).Textures.m_data.
                 super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar13];
        if (pIVar3 == (ITexture *)0x0) {
          lVar6 = *(long *)&(this->super_IRenderTarget).field_0x58;
LAB_001e7a38:
          if (*(int *)(lVar6 + uVar13 * 4) != 0) {
            *(undefined4 *)(lVar6 + uVar13 * 4) = 0;
            UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
            if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
               (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
               UNRECOVERED_JUMPTABLE != (code *)0x0)) {
              in_XMM0_Qa = (double)(*UNRECOVERED_JUMPTABLE)(0x8d40,0,0xde1,0,0);
            }
            in_XMM0_Qa = os::Printer::log((Printer *)"Error: Could not set render target.",
                                          in_XMM0_Qa);
          }
        }
        else {
          lVar6 = *(long *)&(this->super_IRenderTarget).field_0x58;
          if (*(int *)&pIVar3->field_0x84 == 0) goto LAB_001e7a38;
          *(int *)(lVar6 + uVar13 * 4) = (int)(uVar13 + 0x8ce0);
          if (pIVar3->Type == ETT_2D) {
            iVar8 = 0xde1;
          }
          else {
            iVar8 = (this->super_IRenderTarget).CubeSurfaces.m_data.
                    super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar13] + 0x8515;
          }
          UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
          if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
             (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
             UNRECOVERED_JUMPTABLE != (code *)0x0)) {
            in_XMM0_Qa = (double)(*UNRECOVERED_JUMPTABLE)(0x8d40,uVar13 + 0x8ce0,iVar8);
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar5 != uVar13);
      lVar6 = *(long *)&(this->super_IRenderTarget).field_0x58;
      lVar7 = *(long *)&(this->super_IRenderTarget).field_0x60;
      uVar11 = (uint)((ulong)(lVar7 - lVar6) >> 2);
    }
    if (uVar5 < uVar11) {
      uVar14 = uVar14 & 0xffffffff;
      uVar12 = uVar12 & 0xffffffff;
      if (uVar14 < uVar12) {
        uVar12 = uVar14;
      }
      do {
        iVar8 = *(int *)(lVar6 + uVar12 * 4);
        if (iVar8 != 0) {
          UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
          if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
             (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
             UNRECOVERED_JUMPTABLE != (code *)0x0)) {
            (*UNRECOVERED_JUMPTABLE)(0x8d40,iVar8,0xde1,0,0);
            lVar6 = *(long *)&(this->super_IRenderTarget).field_0x58;
            lVar7 = *(long *)&(this->super_IRenderTarget).field_0x60;
          }
          *(undefined4 *)(lVar6 + uVar12 * 4) = 0;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < ((ulong)(lVar7 - lVar6) >> 2 & 0xffffffff));
    }
    this->RequestTextureUpdate = false;
    bVar4 = this->RequestDepthStencilUpdate;
  }
  if ((bVar4 & 1) != 0) {
    pIVar3 = (this->super_IRenderTarget).DepthStencil;
    if ((pIVar3 == (ITexture *)0x0) || (EVar1 = pIVar3->ColorFormat, 2 < EVar1 - ECF_D16)) {
      if (this->AssignedDepth == true) {
        UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
        if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
           (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
           UNRECOVERED_JUMPTABLE != (code *)0x0)) {
          (*UNRECOVERED_JUMPTABLE)(0x8d40,0x8d00,0xde1,0,0);
        }
      }
      if (this->AssignedStencil == true) {
        UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
        if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
           (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
           UNRECOVERED_JUMPTABLE != (code *)0x0)) {
          (*UNRECOVERED_JUMPTABLE)(0x8d40,0x8d20,0xde1,0,0);
        }
      }
      this->AssignedDepth = false;
      this->AssignedStencil = false;
    }
    else {
      uVar2 = *(undefined4 *)&pIVar3->field_0x84;
      UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
      if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
         (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
         UNRECOVERED_JUMPTABLE != (code *)0x0)) {
        (*UNRECOVERED_JUMPTABLE)(0x8d40,0x8d00,0xde1,uVar2,0);
      }
      if (EVar1 == ECF_D24S8) {
        UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
        if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
           (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
           UNRECOVERED_JUMPTABLE != (code *)0x0)) {
          (*UNRECOVERED_JUMPTABLE)(0x8d40,0x8d20,0xde1,uVar2,0);
        }
        this->AssignedStencil = true;
      }
      else {
        if (this->AssignedStencil == true) {
          UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
          if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
             (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
             UNRECOVERED_JUMPTABLE != (code *)0x0)) {
            (*UNRECOVERED_JUMPTABLE)(0x8d40,0x8d20,0xde1,0,0);
          }
        }
        this->AssignedStencil = false;
      }
      this->AssignedDepth = true;
    }
    this->RequestDepthStencilUpdate = false;
  }
  if ((this->ColorAttachment == 0) || (this->BufferID == 0)) {
    return;
  }
  uVar5 = (uint)((ulong)((long)(this->super_IRenderTarget).Textures.m_data.
                               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->super_IRenderTarget).Textures.m_data.
                              super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (uVar5 != 1) {
    if (uVar5 == 0) {
      uVar10 = 0;
      goto LAB_001e7d5c;
    }
    uVar11 = this->MultipleRenderTarget;
    if (uVar11 != 0) {
      lVar6 = *(long *)&(this->super_IRenderTarget).field_0x58;
      uVar12 = *(long *)&(this->super_IRenderTarget).field_0x60 - lVar6;
      lVar7 = 0;
      if (uVar12 != 0) {
        lVar7 = lVar6;
      }
      uVar9 = (uint)(uVar12 >> 2);
      if (uVar5 < uVar9) {
        uVar9 = uVar5;
      }
      if (uVar11 < uVar9) {
        uVar9 = uVar11;
      }
      UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x9b0;
      if ((UNRECOVERED_JUMPTABLE == (code *)0x0) &&
         (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x9b8,
         UNRECOVERED_JUMPTABLE == (code *)0x0)) {
        return;
      }
      (*UNRECOVERED_JUMPTABLE)(uVar9,lVar7);
      return;
    }
  }
  uVar10 = 0x8ce0;
LAB_001e7d5c:
  glDrawBuffer(uVar10);
  return;
}

Assistant:

void update()
	{
		if (RequestTextureUpdate || RequestDepthStencilUpdate) {
			// Set color attachments.

			if (RequestTextureUpdate) {
				// Set new color textures.

				const u32 textureSize = core::min_(Textures.size(), AssignedTextures.size());

				for (u32 i = 0; i < textureSize; ++i) {
					TOpenGLTexture *currentTexture = static_cast<TOpenGLTexture *>(Textures[i]);
					GLuint textureID = currentTexture ? currentTexture->getOpenGLTextureName() : 0;

					if (textureID != 0) {
						AssignedTextures[i] = GL_COLOR_ATTACHMENT0 + i;
						GLenum textarget = currentTexture->getType() == ETT_2D ? GL_TEXTURE_2D : GL_TEXTURE_CUBE_MAP_POSITIVE_X + (int)CubeSurfaces[i];
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, AssignedTextures[i], textarget, textureID, 0);
#ifdef _DEBUG
						Driver->testGLError(__LINE__);
#endif
					} else if (AssignedTextures[i] != GL_NONE) {
						AssignedTextures[i] = GL_NONE;
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, AssignedTextures[i], GL_TEXTURE_2D, 0, 0);

						os::Printer::log("Error: Could not set render target.", ELL_ERROR);
					}
				}

				// Reset other render target channels.

				for (u32 i = textureSize; i < AssignedTextures.size(); ++i) {
					if (AssignedTextures[i] != GL_NONE) {
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, AssignedTextures[i], GL_TEXTURE_2D, 0, 0);
						AssignedTextures[i] = GL_NONE;
					}
				}

				RequestTextureUpdate = false;
			}

			// Set depth and stencil attachments.

			if (RequestDepthStencilUpdate) {
				const ECOLOR_FORMAT textureFormat = (DepthStencil) ? DepthStencil->getColorFormat() : ECF_UNKNOWN;

				if (IImage::isDepthFormat(textureFormat)) {
					GLuint textureID = static_cast<TOpenGLTexture *>(DepthStencil)->getOpenGLTextureName();

#ifdef _IRR_EMSCRIPTEN_PLATFORM_ // The WEBGL_depth_texture extension does not allow attaching stencil+depth separate.
					if (textureFormat == ECF_D24S8) {
						GLenum attachment = 0x821A; // GL_DEPTH_STENCIL_ATTACHMENT
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, attachment, GL_TEXTURE_2D, textureID, 0);
						AssignedStencil = true;
					} else {
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, textureID, 0);
						AssignedStencil = false;
					}
#else
					Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, textureID, 0);

					if (textureFormat == ECF_D24S8) {
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, textureID, 0);

						AssignedStencil = true;
					} else {
						if (AssignedStencil)
							Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, 0, 0);

						AssignedStencil = false;
					}
#endif
					AssignedDepth = true;
				} else {
					if (AssignedDepth)
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, 0, 0);

					if (AssignedStencil)
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, 0, 0);

					AssignedDepth = false;
					AssignedStencil = false;
				}
#ifdef _DEBUG
				Driver->testGLError(__LINE__);
#endif

				RequestDepthStencilUpdate = false;
			}

			// Configure drawing operation.

			if (ColorAttachment > 0 && BufferID != 0) {
				const u32 textureSize = Textures.size();

				if (textureSize == 0)
					Driver->irrGlDrawBuffer(GL_NONE);
				else if (textureSize == 1 || MultipleRenderTarget == 0)
					Driver->irrGlDrawBuffer(GL_COLOR_ATTACHMENT0);
				else {
					const u32 bufferCount = core::min_(MultipleRenderTarget, core::min_(textureSize, AssignedTextures.size()));

					Driver->irrGlDrawBuffers(bufferCount, AssignedTextures.pointer());
				}

#ifdef _DEBUG
				Driver->testGLError(__LINE__);
#endif
			}

#ifdef _DEBUG
			checkFBO(Driver);
#endif
		}
	}